

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  char *pcVar1;
  allocator local_21;
  char *local_20 [2];
  
  pcVar1 = "unknown file";
  if (this != (internal *)0x0) {
    pcVar1 = (char *)this;
  }
  if ((int)file < 0) {
    String::Format((char *)local_20,"%s:",pcVar1);
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_20[0],&local_21);
  }
  else {
    String::Format((char *)local_20,"%s:%d:",pcVar1);
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_20[0],&local_21);
  }
  if (local_20[0] != (char *)0x0) {
    operator_delete__(local_20[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0) {
    return String::Format("%s:", file_name).c_str();
  }
#ifdef _MSC_VER
  return String::Format("%s(%d):", file_name, line).c_str();
#else
  return String::Format("%s:%d:", file_name, line).c_str();
#endif  // _MSC_VER
}